

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeMoveto(BtCursor *pCur,void *pKey,i64 nKey,int bias,int *pRes)

{
  sqlite3 *db;
  int *in_RDX;
  UnpackedRecord *in_RSI;
  void *in_RDI;
  KeyInfo *pKeyInfo;
  UnpackedRecord *pIdxKey;
  UnpackedRecord *in_stack_00000010;
  int rc;
  void *p;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RSI == (UnpackedRecord *)0x0) {
    iVar1 = sqlite3BtreeTableMoveto
                      ((BtCursor *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (i64)in_RDI,0,in_RDX);
  }
  else {
    p = *(void **)((long)in_RDI + 0x80);
    db = (sqlite3 *)
         sqlite3VdbeAllocUnpackedRecord((KeyInfo *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffc8));
    if (db == (sqlite3 *)0x0) {
      iVar1 = 7;
    }
    else {
      sqlite3VdbeRecordUnpack(pKeyInfo,in_stack_fffffffffffffffc,in_RDI,in_RSI);
      if ((*(u16 *)((long)&db->mutex + 4) == 0) ||
         (*(ushort *)((long)p + 8) < *(u16 *)((long)&db->mutex + 4))) {
        iVar1 = sqlite3CorruptError(0);
      }
      else {
        iVar1 = sqlite3BtreeIndexMoveto((BtCursor *)pRes,in_stack_00000010,(int *)pIdxKey);
      }
      sqlite3DbFree(db,p);
    }
  }
  return iVar1;
}

Assistant:

static int btreeMoveto(
  BtCursor *pCur,     /* Cursor open on the btree to be searched */
  const void *pKey,   /* Packed key if the btree is an index */
  i64 nKey,           /* Integer key for tables.  Size of pKey for indices */
  int bias,           /* Bias search to the high end */
  int *pRes           /* Write search results here */
){
  int rc;                    /* Status code */
  UnpackedRecord *pIdxKey;   /* Unpacked index key */

  if( pKey ){
    KeyInfo *pKeyInfo = pCur->pKeyInfo;
    assert( nKey==(i64)(int)nKey );
    pIdxKey = sqlite3VdbeAllocUnpackedRecord(pKeyInfo);
    if( pIdxKey==0 ) return SQLITE_NOMEM_BKPT;
    sqlite3VdbeRecordUnpack(pKeyInfo, (int)nKey, pKey, pIdxKey);
    if( pIdxKey->nField==0 || pIdxKey->nField>pKeyInfo->nAllField ){
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      rc = sqlite3BtreeIndexMoveto(pCur, pIdxKey, pRes);
    }
    sqlite3DbFree(pCur->pKeyInfo->db, pIdxKey);
  }else{
    pIdxKey = 0;
    rc = sqlite3BtreeTableMoveto(pCur, nKey, bias, pRes);
  }
  return rc;
}